

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressBlock_doubleFast
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  seqDef **ppsVar5;
  ulong *puVar6;
  BYTE *pBVar7;
  ulong *puVar8;
  undefined8 *puVar9;
  uint uVar10;
  BYTE *pBVar11;
  U32 *pUVar12;
  U32 *pUVar13;
  BYTE *pBVar14;
  bool bVar15;
  undefined8 uVar16;
  uint uVar17;
  uint uVar18;
  BYTE *pStart;
  ulong *puVar19;
  ulong *puVar20;
  seqDef *psVar21;
  byte bVar22;
  byte bVar23;
  BYTE *pBVar24;
  ulong *puVar25;
  ulong *puVar26;
  ulong *puVar27;
  uint uVar28;
  BYTE *unaff_RBX;
  ulong uVar29;
  BYTE *pInLoopLimit;
  uint uVar30;
  ulong uVar31;
  int *piVar32;
  uint uVar33;
  long lVar34;
  ulong uVar35;
  ulong uVar36;
  int iVar37;
  uint uVar38;
  BYTE *pBVar39;
  BYTE *pBVar40;
  int iVar41;
  BYTE *litEnd;
  ulong *puVar42;
  U32 UVar43;
  BYTE *unaff_R13;
  BYTE *pInLoopLimit_3;
  ulong uVar44;
  BYTE *iend;
  BYTE *litEnd_2;
  BYTE *base;
  U32 prefixLowestIndex;
  BYTE *litLimit_w;
  U32 *hashLong;
  BYTE *ilimit;
  BYTE *prefixLowest;
  BYTE *litLimit_w_8;
  U32 *hashSmall;
  uint local_fc;
  BYTE *local_f0;
  int local_e8;
  BYTE *local_b8;
  BYTE *local_90;
  int local_88;
  BYTE *local_80;
  int local_60;
  int local_58;
  int local_50;
  
  pBVar11 = (ms->window).base;
  puVar6 = (ulong *)((long)src + srcSize);
  iVar37 = (int)pBVar11;
  iVar41 = (int)puVar6 - iVar37;
  uVar17 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar10 = (ms->window).dictLimit;
  uVar18 = iVar41 - uVar17;
  if (iVar41 - uVar10 <= uVar17) {
    uVar18 = uVar10;
  }
  pBVar39 = pBVar11 + uVar18;
  puVar8 = (ulong *)((long)src + (srcSize - 8));
  uVar10 = *rep;
  uVar17 = rep[1];
  puVar19 = (ulong *)((ulong)((int)src == (int)pBVar39) + (long)src);
  uVar30 = (int)puVar19 - (int)pBVar39;
  uVar44 = (ulong)uVar17;
  if (uVar30 < uVar17) {
    uVar44 = 0;
  }
  uVar38 = (uint)uVar44;
  local_fc = 0;
  if (uVar10 <= uVar30) {
    local_fc = uVar10;
  }
  uVar28 = (ms->cParams).minMatch;
  pUVar12 = ms->hashTable;
  pUVar13 = ms->chainTable;
  if (uVar28 == 5) {
    if (puVar19 < puVar8) {
      bVar22 = 0x40 - (char)(ms->cParams).hashLog;
      bVar23 = 0x40 - (char)(ms->cParams).chainLog;
      puVar1 = (ulong *)((long)puVar6 + -7);
      puVar2 = (ulong *)((long)puVar6 + -3);
      puVar3 = (ulong *)((long)puVar6 + -1);
      puVar4 = puVar6 + -4;
      ppsVar5 = &seqStore->sequences;
      pBVar24 = pBVar11 + -1;
      local_90 = pBVar24;
LAB_0011458f:
      uVar29 = *puVar19;
      uVar31 = uVar29 * -0x30e44323485a9b9d >> (bVar22 & 0x3f);
      uVar35 = uVar29 * -0x30e4432345000000 >> (bVar23 & 0x3f);
      UVar43 = (int)puVar19 - iVar37;
      uVar38 = pUVar12[uVar31];
      uVar28 = pUVar13[uVar35];
      pUVar13[uVar35] = UVar43;
      pUVar12[uVar31] = UVar43;
      puVar27 = (ulong *)((long)puVar19 + 1);
      if ((local_fc == 0) ||
         (uVar31 = (ulong)local_fc, *(int *)((long)puVar27 - uVar31) != *(int *)((long)puVar19 + 1))
         ) {
        if ((uVar18 < uVar38) && (puVar42 = (ulong *)(pBVar11 + uVar38), *puVar42 == uVar29)) {
          puVar27 = puVar19 + 1;
          puVar20 = puVar42 + 1;
          puVar25 = puVar27;
          if (puVar27 < puVar1) {
            uVar29 = *puVar27 ^ *puVar20;
            uVar44 = 0;
            if (uVar29 != 0) {
              for (; (uVar29 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
              }
            }
            pBVar40 = (BYTE *)(uVar44 >> 3 & 0x1fffffff);
            if (*puVar20 == *puVar27) {
              puVar25 = puVar19 + 2;
              puVar20 = puVar42 + 2;
              do {
                if (puVar1 <= puVar25) goto LAB_00114a12;
                uVar44 = *puVar20;
                uVar29 = *puVar25;
                uVar35 = uVar29 ^ uVar44;
                uVar31 = 0;
                if (uVar35 != 0) {
                  for (; (uVar35 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                  }
                }
                pBVar40 = (BYTE *)((long)puVar25 + ((uVar31 >> 3 & 0x1fffffff) - (long)puVar27));
                puVar25 = puVar25 + 1;
                puVar20 = puVar20 + 1;
              } while (uVar44 == uVar29);
            }
          }
          else {
LAB_00114a12:
            if ((puVar25 < puVar2) && ((int)*puVar20 == (int)*puVar25)) {
              puVar25 = (ulong *)((long)puVar25 + 4);
              puVar20 = (ulong *)((long)puVar20 + 4);
            }
            if ((puVar25 < puVar3) && ((short)*puVar20 == (short)*puVar25)) {
              puVar25 = (ulong *)((long)puVar25 + 2);
              puVar20 = (ulong *)((long)puVar20 + 2);
            }
            if (puVar25 < puVar6) {
              puVar25 = (ulong *)((long)puVar25 + (ulong)((BYTE)*puVar20 == (BYTE)*puVar25));
            }
            pBVar40 = (BYTE *)((long)puVar25 - (long)puVar27);
          }
          unaff_R13 = pBVar40 + 8;
          local_90 = (BYTE *)(ulong)(uint)((int)puVar19 - (int)puVar42);
          puVar27 = puVar19;
          if ((uVar18 < uVar38) && (src < puVar19)) {
            pBVar40 = pBVar24 + uVar38;
            puVar19 = (ulong *)((long)puVar19 + -1);
            do {
              if ((BYTE)*puVar19 != *pBVar40) goto LAB_00114cda;
              unaff_R13 = unaff_R13 + 1;
              puVar27 = (ulong *)((long)puVar19 + -1);
            } while ((pBVar39 < pBVar40) &&
                    (pBVar40 = pBVar40 + -1, bVar15 = src < puVar19, puVar19 = puVar27, bVar15));
LAB_00114aae:
            puVar27 = (ulong *)((long)puVar27 + 1);
          }
          goto LAB_00114ce0;
        }
        if ((uVar18 < uVar28) && (piVar32 = (int *)(pBVar11 + uVar28), *piVar32 == (int)*puVar19)) {
          uVar29 = *puVar27;
          uVar31 = uVar29 * -0x30e44323485a9b9d >> (bVar22 & 0x3f);
          uVar38 = pUVar12[uVar31];
          pUVar12[uVar31] = UVar43 + 1;
          iVar41 = 0;
          puVar42 = puVar19;
          if ((uVar18 < uVar38) && (puVar25 = (ulong *)(pBVar11 + uVar38), *puVar25 == uVar29)) {
            puVar42 = (ulong *)((long)puVar19 + 9);
            puVar26 = puVar25 + 1;
            puVar20 = puVar42;
            if (puVar42 < puVar1) {
              uVar31 = *puVar42 ^ *puVar26;
              uVar29 = 0;
              if (uVar31 != 0) {
                for (; (uVar31 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                }
              }
              pBVar40 = (BYTE *)(uVar29 >> 3 & 0x1fffffff);
              if (*puVar26 == *puVar42) {
                puVar20 = (ulong *)((long)puVar19 + 0x11);
                puVar26 = puVar25 + 2;
                do {
                  if (puVar1 <= puVar20) goto LAB_00114ab9;
                  uVar29 = *puVar26;
                  uVar31 = *puVar20;
                  uVar36 = uVar31 ^ uVar29;
                  uVar35 = 0;
                  if (uVar36 != 0) {
                    for (; (uVar36 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                    }
                  }
                  pBVar40 = (BYTE *)((long)puVar20 + ((uVar35 >> 3 & 0x1fffffff) - (long)puVar42));
                  puVar20 = puVar20 + 1;
                  puVar26 = puVar26 + 1;
                } while (uVar29 == uVar31);
              }
            }
            else {
LAB_00114ab9:
              if ((puVar20 < puVar2) && ((int)*puVar26 == (int)*puVar20)) {
                puVar20 = (ulong *)((long)puVar20 + 4);
                puVar26 = (ulong *)((long)puVar26 + 4);
              }
              if ((puVar20 < puVar3) && ((short)*puVar26 == (short)*puVar20)) {
                puVar20 = (ulong *)((long)puVar20 + 2);
                puVar26 = (ulong *)((long)puVar26 + 2);
              }
              if (puVar20 < puVar6) {
                puVar20 = (ulong *)((long)puVar20 + (ulong)((BYTE)*puVar26 == (BYTE)*puVar20));
              }
              pBVar40 = (BYTE *)((long)puVar20 - (long)puVar42);
            }
            unaff_R13 = pBVar40 + 8;
            local_58 = (int)puVar25;
            local_90 = (BYTE *)(ulong)(uint)((int)puVar27 - local_58);
            iVar41 = 7;
            puVar42 = puVar27;
            if ((uVar18 < uVar38) && (src < puVar27)) {
              pBVar40 = pBVar24 + uVar38;
              while (puVar42 = puVar19, (BYTE)*puVar42 == *pBVar40) {
                unaff_R13 = unaff_R13 + 1;
                if ((pBVar40 <= pBVar39) ||
                   (pBVar40 = pBVar40 + -1, puVar19 = (ulong *)((long)puVar42 + -1), puVar42 <= src)
                   ) goto LAB_00114b7e;
              }
              puVar42 = (ulong *)((long)puVar42 + 1);
            }
          }
LAB_00114b7e:
          puVar27 = puVar42;
          if (iVar41 != 7) {
            if (iVar41 != 0) goto LAB_00115113;
            puVar19 = (ulong *)((long)puVar42 + 4);
            puVar20 = (ulong *)(piVar32 + 1);
            puVar25 = puVar19;
            if (puVar19 < puVar1) {
              uVar29 = *puVar19 ^ *puVar20;
              uVar44 = 0;
              if (uVar29 != 0) {
                for (; (uVar29 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                }
              }
              pBVar40 = (BYTE *)(uVar44 >> 3 & 0x1fffffff);
              if (*puVar20 == *puVar19) {
                puVar25 = (ulong *)((long)puVar42 + 0xc);
                puVar20 = (ulong *)(piVar32 + 3);
                do {
                  if (puVar1 <= puVar25) goto LAB_00114c39;
                  uVar44 = *puVar20;
                  uVar29 = *puVar25;
                  uVar35 = uVar29 ^ uVar44;
                  uVar31 = 0;
                  if (uVar35 != 0) {
                    for (; (uVar35 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                    }
                  }
                  pBVar40 = (BYTE *)((long)puVar25 + ((uVar31 >> 3 & 0x1fffffff) - (long)puVar19));
                  puVar25 = puVar25 + 1;
                  puVar20 = puVar20 + 1;
                } while (uVar44 == uVar29);
              }
            }
            else {
LAB_00114c39:
              if ((puVar25 < puVar2) && ((int)*puVar20 == (int)*puVar25)) {
                puVar25 = (ulong *)((long)puVar25 + 4);
                puVar20 = (ulong *)((long)puVar20 + 4);
              }
              if ((puVar25 < puVar3) && ((short)*puVar20 == (short)*puVar25)) {
                puVar25 = (ulong *)((long)puVar25 + 2);
                puVar20 = (ulong *)((long)puVar20 + 2);
              }
              if (puVar25 < puVar6) {
                puVar25 = (ulong *)((long)puVar25 + (ulong)((BYTE)*puVar20 == (BYTE)*puVar25));
              }
              pBVar40 = (BYTE *)((long)puVar25 - (long)puVar19);
            }
            unaff_R13 = pBVar40 + 4;
            local_80._0_4_ = (int)piVar32;
            local_90 = (BYTE *)(ulong)(uint)((int)puVar42 - (int)local_80);
            if ((uVar18 < uVar28) && (src < puVar42)) {
              pBVar40 = pBVar24 + uVar28;
              puVar19 = (ulong *)((long)puVar42 + -1);
              do {
                if ((BYTE)*puVar19 != *pBVar40) goto LAB_00114cda;
                unaff_R13 = unaff_R13 + 1;
                puVar27 = (ulong *)((long)puVar19 + -1);
              } while ((pBVar39 < pBVar40) &&
                      (pBVar40 = pBVar40 + -1, bVar15 = src < puVar19, puVar19 = puVar27, bVar15));
              goto LAB_00114aae;
            }
          }
          goto LAB_00114ce0;
        }
        puVar42 = (ulong *)((long)puVar19 + ((long)puVar19 - (long)src >> 8) + 1);
        goto LAB_00115113;
      }
      puVar42 = (ulong *)((long)puVar19 + 5);
      puVar20 = (ulong *)((long)puVar19 + (5 - uVar31));
      puVar25 = puVar42;
      if (puVar42 < puVar1) {
        uVar35 = *puVar42 ^ *puVar20;
        uVar29 = 0;
        if (uVar35 != 0) {
          for (; (uVar35 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
          }
        }
        pBVar40 = (BYTE *)(uVar29 >> 3 & 0x1fffffff);
        if (*puVar20 == *puVar42) {
          puVar25 = (ulong *)((long)puVar19 + 0xd);
          puVar20 = (ulong *)((long)puVar19 + (0xd - uVar31));
          do {
            if (puVar1 <= puVar25) goto LAB_0011486b;
            uVar29 = *puVar20;
            uVar31 = *puVar25;
            uVar36 = uVar31 ^ uVar29;
            uVar35 = 0;
            if (uVar36 != 0) {
              for (; (uVar36 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
              }
            }
            pBVar40 = (BYTE *)((long)puVar25 + ((uVar35 >> 3 & 0x1fffffff) - (long)puVar42));
            puVar25 = puVar25 + 1;
            puVar20 = puVar20 + 1;
          } while (uVar29 == uVar31);
        }
      }
      else {
LAB_0011486b:
        if ((puVar25 < puVar2) && ((int)*puVar20 == (int)*puVar25)) {
          puVar25 = (ulong *)((long)puVar25 + 4);
          puVar20 = (ulong *)((long)puVar20 + 4);
        }
        if ((puVar25 < puVar3) && ((short)*puVar20 == (short)*puVar25)) {
          puVar25 = (ulong *)((long)puVar25 + 2);
          puVar20 = (ulong *)((long)puVar20 + 2);
        }
        if (puVar25 < puVar6) {
          puVar25 = (ulong *)((long)puVar25 + (ulong)((BYTE)*puVar20 == (BYTE)*puVar25));
        }
        pBVar40 = (BYTE *)((long)puVar25 - (long)puVar42);
      }
      if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
          seqStore->maxNbSeq) {
        if (seqStore->maxNbLit < 0x20001) {
          uVar29 = (long)puVar27 - (long)src;
          puVar19 = (ulong *)seqStore->lit;
          if ((BYTE *)((long)puVar19 + uVar29) <= seqStore->litStart + seqStore->maxNbLit) {
            if (puVar6 < puVar27) goto LAB_00115d85;
            if (puVar4 < puVar27) {
              ZSTD_safecopyLiterals((BYTE *)puVar19,(BYTE *)src,(BYTE *)puVar27,(BYTE *)puVar4);
            }
            else {
              uVar31 = *(ulong *)((long)src + 8);
              *puVar19 = *src;
              puVar19[1] = uVar31;
              if (0x10 < uVar29) {
                pBVar14 = seqStore->lit;
                puVar19 = (ulong *)(pBVar14 + 0x10);
                puVar42 = (ulong *)((long)src + 0x10);
                if (0xffffffffffffffe8 < (ulong)((long)puVar19 + (-8 - (long)puVar42)))
                goto LAB_00115e20;
                if (0xffffffffffffffe0 < (ulong)((long)puVar19 + (-0x10 - (long)puVar42)))
                goto LAB_00115e3f;
                uVar31 = *(ulong *)((long)src + 0x18);
                *puVar19 = *puVar42;
                *(ulong *)(pBVar14 + 0x18) = uVar31;
                if (0x20 < (long)uVar29) {
                  lVar34 = 0;
                  do {
                    puVar9 = (undefined8 *)((long)src + lVar34 + 0x20);
                    uVar16 = puVar9[1];
                    pBVar7 = pBVar14 + lVar34 + 0x20;
                    *(undefined8 *)pBVar7 = *puVar9;
                    *(undefined8 *)(pBVar7 + 8) = uVar16;
                    puVar9 = (undefined8 *)((long)src + lVar34 + 0x30);
                    uVar16 = puVar9[1];
                    *(undefined8 *)(pBVar7 + 0x10) = *puVar9;
                    *(undefined8 *)(pBVar7 + 0x18) = uVar16;
                    lVar34 = lVar34 + 0x20;
                  } while (pBVar7 + 0x20 < pBVar14 + uVar29);
                }
              }
            }
            seqStore->lit = seqStore->lit + uVar29;
            if (0xffff < uVar29) {
              if (seqStore->longLengthID != 0) goto LAB_00115e01;
              seqStore->longLengthID = 1;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
            unaff_R13 = pBVar40 + 4;
            pBVar40 = pBVar40 + 1;
            psVar21 = *ppsVar5;
            psVar21->litLength = (U16)uVar29;
            psVar21->offset = 1;
            uVar38 = local_fc;
            if (pBVar40 < (BYTE *)0x10000) goto LAB_00114e5f;
            if (seqStore->longLengthID == 0) goto LAB_00114e43;
            goto LAB_00115de2;
          }
          goto LAB_00115d66;
        }
        goto LAB_00115dc3;
      }
      goto LAB_00115da4;
    }
  }
  else if (uVar28 == 6) {
    if (puVar19 < puVar8) {
      bVar22 = 0x40 - (char)(ms->cParams).hashLog;
      bVar23 = 0x40 - (char)(ms->cParams).chainLog;
      puVar1 = (ulong *)((long)puVar6 + -7);
      puVar2 = (ulong *)((long)puVar6 + -3);
      puVar3 = (ulong *)((long)puVar6 + -1);
      puVar4 = puVar6 + -4;
      ppsVar5 = &seqStore->sequences;
      pBVar24 = pBVar11 + -1;
      local_80 = pBVar24;
LAB_0011394f:
      uVar29 = *puVar19;
      uVar31 = uVar29 * -0x30e44323485a9b9d >> (bVar22 & 0x3f);
      uVar35 = uVar29 * -0x30e4432340650000 >> (bVar23 & 0x3f);
      UVar43 = (int)puVar19 - iVar37;
      uVar38 = pUVar12[uVar31];
      uVar28 = pUVar13[uVar35];
      pUVar13[uVar35] = UVar43;
      pUVar12[uVar31] = UVar43;
      puVar27 = (ulong *)((long)puVar19 + 1);
      if ((local_fc == 0) ||
         (uVar31 = (ulong)local_fc, *(int *)((long)puVar27 - uVar31) != *(int *)((long)puVar19 + 1))
         ) {
        if ((uVar18 < uVar38) && (puVar42 = (ulong *)(pBVar11 + uVar38), *puVar42 == uVar29)) {
          puVar27 = puVar19 + 1;
          puVar20 = puVar42 + 1;
          puVar25 = puVar27;
          if (puVar27 < puVar1) {
            uVar29 = *puVar27 ^ *puVar20;
            uVar44 = 0;
            if (uVar29 != 0) {
              for (; (uVar29 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
              }
            }
            pBVar40 = (BYTE *)(uVar44 >> 3 & 0x1fffffff);
            if (*puVar20 == *puVar27) {
              puVar25 = puVar19 + 2;
              puVar20 = puVar42 + 2;
              do {
                if (puVar1 <= puVar25) goto LAB_00113deb;
                uVar44 = *puVar20;
                uVar29 = *puVar25;
                uVar35 = uVar29 ^ uVar44;
                uVar31 = 0;
                if (uVar35 != 0) {
                  for (; (uVar35 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                  }
                }
                pBVar40 = (BYTE *)((long)puVar25 + ((uVar31 >> 3 & 0x1fffffff) - (long)puVar27));
                puVar25 = puVar25 + 1;
                puVar20 = puVar20 + 1;
              } while (uVar44 == uVar29);
            }
          }
          else {
LAB_00113deb:
            if ((puVar25 < puVar2) && ((int)*puVar20 == (int)*puVar25)) {
              puVar25 = (ulong *)((long)puVar25 + 4);
              puVar20 = (ulong *)((long)puVar20 + 4);
            }
            if ((puVar25 < puVar3) && ((short)*puVar20 == (short)*puVar25)) {
              puVar25 = (ulong *)((long)puVar25 + 2);
              puVar20 = (ulong *)((long)puVar20 + 2);
            }
            if (puVar25 < puVar6) {
              puVar25 = (ulong *)((long)puVar25 + (ulong)((BYTE)*puVar20 == (BYTE)*puVar25));
            }
            pBVar40 = (BYTE *)((long)puVar25 - (long)puVar27);
          }
          local_f0 = pBVar40 + 8;
          local_80 = (BYTE *)(ulong)(uint)((int)puVar19 - (int)puVar42);
          puVar27 = puVar19;
          if ((uVar18 < uVar38) && (src < puVar19)) {
            pBVar40 = pBVar24 + uVar38;
            puVar19 = (ulong *)((long)puVar19 + -1);
            do {
              if ((BYTE)*puVar19 != *pBVar40) goto LAB_001140e7;
              local_f0 = local_f0 + 1;
              puVar27 = (ulong *)((long)puVar19 + -1);
            } while ((pBVar39 < pBVar40) &&
                    (pBVar40 = pBVar40 + -1, bVar15 = src < puVar19, puVar19 = puVar27, bVar15));
LAB_00113e8e:
            puVar27 = (ulong *)((long)puVar27 + 1);
          }
          goto LAB_001140ed;
        }
        if ((uVar18 < uVar28) && (piVar32 = (int *)(pBVar11 + uVar28), *piVar32 == (int)*puVar19)) {
          uVar29 = *puVar27;
          uVar31 = uVar29 * -0x30e44323485a9b9d >> (bVar22 & 0x3f);
          uVar38 = pUVar12[uVar31];
          pUVar12[uVar31] = UVar43 + 1;
          iVar41 = 0;
          puVar42 = puVar19;
          if ((uVar18 < uVar38) && (puVar25 = (ulong *)(pBVar11 + uVar38), *puVar25 == uVar29)) {
            puVar42 = (ulong *)((long)puVar19 + 9);
            puVar26 = puVar25 + 1;
            puVar20 = puVar42;
            if (puVar42 < puVar1) {
              uVar31 = *puVar42 ^ *puVar26;
              uVar29 = 0;
              if (uVar31 != 0) {
                for (; (uVar31 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                }
              }
              local_f0 = (BYTE *)(uVar29 >> 3 & 0x1fffffff);
              if (*puVar26 == *puVar42) {
                puVar20 = (ulong *)((long)puVar19 + 0x11);
                puVar26 = puVar25 + 2;
                do {
                  if (puVar1 <= puVar20) goto LAB_00113e99;
                  uVar29 = *puVar26;
                  uVar31 = *puVar20;
                  uVar36 = uVar31 ^ uVar29;
                  uVar35 = 0;
                  if (uVar36 != 0) {
                    for (; (uVar36 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                    }
                  }
                  local_f0 = (BYTE *)((long)puVar20 + ((uVar35 >> 3 & 0x1fffffff) - (long)puVar42));
                  puVar20 = puVar20 + 1;
                  puVar26 = puVar26 + 1;
                } while (uVar29 == uVar31);
              }
            }
            else {
LAB_00113e99:
              if ((puVar20 < puVar2) && ((int)*puVar26 == (int)*puVar20)) {
                puVar20 = (ulong *)((long)puVar20 + 4);
                puVar26 = (ulong *)((long)puVar26 + 4);
              }
              if ((puVar20 < puVar3) && ((short)*puVar26 == (short)*puVar20)) {
                puVar20 = (ulong *)((long)puVar20 + 2);
                puVar26 = (ulong *)((long)puVar26 + 2);
              }
              if (puVar20 < puVar6) {
                puVar20 = (ulong *)((long)puVar20 + (ulong)((BYTE)*puVar26 == (BYTE)*puVar20));
              }
              local_f0 = (BYTE *)((long)puVar20 - (long)puVar42);
            }
            local_f0 = local_f0 + 8;
            local_50 = (int)puVar25;
            local_80 = (BYTE *)(ulong)(uint)((int)puVar27 - local_50);
            iVar41 = 7;
            puVar42 = puVar27;
            if ((uVar18 < uVar38) && (src < puVar27)) {
              pBVar40 = pBVar24 + uVar38;
              while (puVar42 = puVar19, (BYTE)*puVar42 == *pBVar40) {
                local_f0 = local_f0 + 1;
                if ((pBVar40 <= pBVar39) ||
                   (pBVar40 = pBVar40 + -1, puVar19 = (ulong *)((long)puVar42 + -1), puVar42 <= src)
                   ) goto LAB_00113f7f;
              }
              puVar42 = (ulong *)((long)puVar42 + 1);
            }
          }
LAB_00113f7f:
          puVar27 = puVar42;
          if (iVar41 != 7) {
            if (iVar41 != 0) goto LAB_00114517;
            puVar19 = (ulong *)((long)puVar42 + 4);
            puVar20 = (ulong *)(piVar32 + 1);
            puVar25 = puVar19;
            if (puVar19 < puVar1) {
              uVar29 = *puVar19 ^ *puVar20;
              uVar44 = 0;
              if (uVar29 != 0) {
                for (; (uVar29 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                }
              }
              pBVar40 = (BYTE *)(uVar44 >> 3 & 0x1fffffff);
              if (*puVar20 == *puVar19) {
                puVar25 = (ulong *)((long)puVar42 + 0xc);
                puVar20 = (ulong *)(piVar32 + 3);
                do {
                  if (puVar1 <= puVar25) goto LAB_00114042;
                  uVar44 = *puVar20;
                  uVar29 = *puVar25;
                  uVar35 = uVar29 ^ uVar44;
                  uVar31 = 0;
                  if (uVar35 != 0) {
                    for (; (uVar35 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                    }
                  }
                  pBVar40 = (BYTE *)((long)puVar25 + ((uVar31 >> 3 & 0x1fffffff) - (long)puVar19));
                  puVar25 = puVar25 + 1;
                  puVar20 = puVar20 + 1;
                } while (uVar44 == uVar29);
              }
            }
            else {
LAB_00114042:
              if ((puVar25 < puVar2) && ((int)*puVar20 == (int)*puVar25)) {
                puVar25 = (ulong *)((long)puVar25 + 4);
                puVar20 = (ulong *)((long)puVar20 + 4);
              }
              if ((puVar25 < puVar3) && ((short)*puVar20 == (short)*puVar25)) {
                puVar25 = (ulong *)((long)puVar25 + 2);
                puVar20 = (ulong *)((long)puVar20 + 2);
              }
              if (puVar25 < puVar6) {
                puVar25 = (ulong *)((long)puVar25 + (ulong)((BYTE)*puVar20 == (BYTE)*puVar25));
              }
              pBVar40 = (BYTE *)((long)puVar25 - (long)puVar19);
            }
            local_f0 = pBVar40 + 4;
            local_60 = (int)piVar32;
            local_80 = (BYTE *)(ulong)(uint)((int)puVar42 - local_60);
            if ((uVar18 < uVar28) && (src < puVar42)) {
              pBVar40 = pBVar24 + uVar28;
              puVar19 = (ulong *)((long)puVar42 + -1);
              do {
                if ((BYTE)*puVar19 != *pBVar40) goto LAB_001140e7;
                local_f0 = local_f0 + 1;
                puVar27 = (ulong *)((long)puVar19 + -1);
              } while ((pBVar39 < pBVar40) &&
                      (pBVar40 = pBVar40 + -1, bVar15 = src < puVar19, puVar19 = puVar27, bVar15));
              goto LAB_00113e8e;
            }
          }
          goto LAB_001140ed;
        }
        puVar42 = (ulong *)((long)puVar19 + ((long)puVar19 - (long)src >> 8) + 1);
        goto LAB_00114517;
      }
      puVar42 = (ulong *)((long)puVar19 + 5);
      puVar20 = (ulong *)((long)puVar19 + (5 - uVar31));
      puVar25 = puVar42;
      if (puVar42 < puVar1) {
        uVar35 = *puVar42 ^ *puVar20;
        uVar29 = 0;
        if (uVar35 != 0) {
          for (; (uVar35 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
          }
        }
        pBVar40 = (BYTE *)(uVar29 >> 3 & 0x1fffffff);
        if (*puVar20 == *puVar42) {
          puVar25 = (ulong *)((long)puVar19 + 0xd);
          puVar20 = (ulong *)((long)puVar19 + (0xd - uVar31));
          do {
            if (puVar1 <= puVar25) goto LAB_00113c3c;
            uVar29 = *puVar20;
            uVar31 = *puVar25;
            uVar36 = uVar31 ^ uVar29;
            uVar35 = 0;
            if (uVar36 != 0) {
              for (; (uVar36 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
              }
            }
            pBVar40 = (BYTE *)((long)puVar25 + ((uVar35 >> 3 & 0x1fffffff) - (long)puVar42));
            puVar25 = puVar25 + 1;
            puVar20 = puVar20 + 1;
          } while (uVar29 == uVar31);
        }
      }
      else {
LAB_00113c3c:
        if ((puVar25 < puVar2) && ((int)*puVar20 == (int)*puVar25)) {
          puVar25 = (ulong *)((long)puVar25 + 4);
          puVar20 = (ulong *)((long)puVar20 + 4);
        }
        if ((puVar25 < puVar3) && ((short)*puVar20 == (short)*puVar25)) {
          puVar25 = (ulong *)((long)puVar25 + 2);
          puVar20 = (ulong *)((long)puVar20 + 2);
        }
        if (puVar25 < puVar6) {
          puVar25 = (ulong *)((long)puVar25 + (ulong)((BYTE)*puVar20 == (BYTE)*puVar25));
        }
        pBVar40 = (BYTE *)((long)puVar25 - (long)puVar42);
      }
      if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
          seqStore->maxNbSeq) {
        if (seqStore->maxNbLit < 0x20001) {
          uVar29 = (long)puVar27 - (long)src;
          puVar19 = (ulong *)seqStore->lit;
          if ((BYTE *)((long)puVar19 + uVar29) <= seqStore->litStart + seqStore->maxNbLit) {
            if (puVar6 < puVar27) goto LAB_00115d85;
            if (puVar4 < puVar27) {
              ZSTD_safecopyLiterals((BYTE *)puVar19,(BYTE *)src,(BYTE *)puVar27,(BYTE *)puVar4);
            }
            else {
              uVar31 = *(ulong *)((long)src + 8);
              *puVar19 = *src;
              puVar19[1] = uVar31;
              if (0x10 < uVar29) {
                pBVar14 = seqStore->lit;
                puVar19 = (ulong *)(pBVar14 + 0x10);
                puVar42 = (ulong *)((long)src + 0x10);
                if (0xffffffffffffffe8 < (ulong)((long)puVar19 + (-8 - (long)puVar42)))
                goto LAB_00115e20;
                if (0xffffffffffffffe0 < (ulong)((long)puVar19 + (-0x10 - (long)puVar42)))
                goto LAB_00115e3f;
                uVar31 = *(ulong *)((long)src + 0x18);
                *puVar19 = *puVar42;
                *(ulong *)(pBVar14 + 0x18) = uVar31;
                if (0x20 < (long)uVar29) {
                  lVar34 = 0;
                  do {
                    puVar9 = (undefined8 *)((long)src + lVar34 + 0x20);
                    uVar16 = puVar9[1];
                    pBVar7 = pBVar14 + lVar34 + 0x20;
                    *(undefined8 *)pBVar7 = *puVar9;
                    *(undefined8 *)(pBVar7 + 8) = uVar16;
                    puVar9 = (undefined8 *)((long)src + lVar34 + 0x30);
                    uVar16 = puVar9[1];
                    *(undefined8 *)(pBVar7 + 0x10) = *puVar9;
                    *(undefined8 *)(pBVar7 + 0x18) = uVar16;
                    lVar34 = lVar34 + 0x20;
                  } while (pBVar7 + 0x20 < pBVar14 + uVar29);
                }
              }
            }
            seqStore->lit = seqStore->lit + uVar29;
            if (0xffff < uVar29) {
              if (seqStore->longLengthID != 0) goto LAB_00115e01;
              seqStore->longLengthID = 1;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
            local_f0 = pBVar40 + 4;
            pBVar40 = pBVar40 + 1;
            psVar21 = *ppsVar5;
            psVar21->litLength = (U16)uVar29;
            psVar21->offset = 1;
            uVar38 = local_fc;
            if (pBVar40 < (BYTE *)0x10000) goto LAB_00114273;
            if (seqStore->longLengthID == 0) goto LAB_00114255;
            goto LAB_00115de2;
          }
          goto LAB_00115d66;
        }
        goto LAB_00115dc3;
      }
      goto LAB_00115da4;
    }
  }
  else if (uVar28 == 7) {
    if (puVar19 < puVar8) {
      bVar22 = 0x40 - (char)(ms->cParams).hashLog;
      bVar23 = 0x40 - (char)(ms->cParams).chainLog;
      puVar1 = (ulong *)((long)puVar6 - 7);
      puVar2 = (ulong *)((long)puVar6 - 3);
      puVar3 = (ulong *)((long)puVar6 - 1);
      puVar4 = puVar6 + -4;
      ppsVar5 = &seqStore->sequences;
      pBVar24 = pBVar11 + -1;
      local_80 = pBVar24;
LAB_00112ce8:
      uVar29 = *puVar19;
      uVar31 = uVar29 * -0x30e44323485a9b9d >> (bVar22 & 0x3f);
      uVar35 = uVar29 * -0x30e44323405a9d00 >> (bVar23 & 0x3f);
      UVar43 = (int)puVar19 - iVar37;
      uVar38 = pUVar12[uVar31];
      uVar28 = pUVar13[uVar35];
      pUVar13[uVar35] = UVar43;
      pUVar12[uVar31] = UVar43;
      puVar27 = (ulong *)((long)puVar19 + 1);
      puVar42 = puVar27;
      if ((local_fc == 0) ||
         (uVar31 = (ulong)local_fc, *(int *)((long)puVar27 - uVar31) != *(int *)((long)puVar19 + 1))
         ) {
        puVar42 = puVar19;
        if ((uVar18 < uVar38) && (puVar25 = (ulong *)(pBVar11 + uVar38), *puVar25 == uVar29)) {
          puVar27 = puVar19 + 1;
          puVar26 = puVar25 + 1;
          puVar20 = puVar27;
          if (puVar27 < puVar1) {
            uVar29 = *puVar27 ^ *puVar26;
            uVar44 = 0;
            if (uVar29 != 0) {
              for (; (uVar29 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
              }
            }
            pBVar40 = (BYTE *)(uVar44 >> 3 & 0x1fffffff);
            if (*puVar26 == *puVar27) {
              puVar20 = puVar19 + 2;
              puVar26 = puVar25 + 2;
              do {
                if (puVar1 <= puVar20) goto LAB_00113184;
                uVar44 = *puVar26;
                uVar29 = *puVar20;
                uVar35 = uVar29 ^ uVar44;
                uVar31 = 0;
                if (uVar35 != 0) {
                  for (; (uVar35 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                  }
                }
                pBVar40 = (BYTE *)((long)puVar20 + ((uVar31 >> 3 & 0x1fffffff) - (long)puVar27));
                puVar20 = puVar20 + 1;
                puVar26 = puVar26 + 1;
              } while (uVar44 == uVar29);
            }
          }
          else {
LAB_00113184:
            if ((puVar20 < puVar2) && ((int)*puVar26 == (int)*puVar20)) {
              puVar20 = (ulong *)((long)puVar20 + 4);
              puVar26 = (ulong *)((long)puVar26 + 4);
            }
            if ((puVar20 < puVar3) && ((short)*puVar26 == (short)*puVar20)) {
              puVar20 = (ulong *)((long)puVar20 + 2);
              puVar26 = (ulong *)((long)puVar26 + 2);
            }
            if (puVar20 < puVar6) {
              puVar20 = (ulong *)((long)puVar20 + (ulong)((BYTE)*puVar26 == (BYTE)*puVar20));
            }
            pBVar40 = (BYTE *)((long)puVar20 - (long)puVar27);
          }
          local_f0 = pBVar40 + 8;
          local_80 = (BYTE *)(ulong)(uint)((int)puVar19 - (int)puVar25);
          if ((uVar18 < uVar38) && (src < puVar19)) {
            pBVar40 = pBVar24 + uVar38;
            puVar42 = (ulong *)((long)puVar19 + -1);
            do {
              if ((BYTE)*puVar42 != *pBVar40) goto LAB_00113485;
              local_f0 = local_f0 + 1;
              puVar19 = (ulong *)((long)puVar42 + -1);
            } while ((pBVar39 < pBVar40) &&
                    (pBVar40 = pBVar40 + -1, bVar15 = src < puVar42, puVar42 = puVar19, bVar15));
LAB_00113227:
            puVar42 = (ulong *)((long)puVar19 + 1);
          }
          goto LAB_0011348b;
        }
        if ((uVar18 < uVar28) && (piVar32 = (int *)(pBVar11 + uVar28), *piVar32 == (int)*puVar19)) {
          uVar29 = *puVar27;
          uVar31 = uVar29 * -0x30e44323485a9b9d >> (bVar22 & 0x3f);
          uVar38 = pUVar12[uVar31];
          pUVar12[uVar31] = UVar43 + 1;
          iVar41 = 0;
          if ((uVar18 < uVar38) && (puVar25 = (ulong *)(pBVar11 + uVar38), *puVar25 == uVar29)) {
            puVar42 = (ulong *)((long)puVar19 + 9);
            puVar26 = puVar25 + 1;
            puVar20 = puVar42;
            if (puVar42 < puVar1) {
              uVar31 = *puVar42 ^ *puVar26;
              uVar29 = 0;
              if (uVar31 != 0) {
                for (; (uVar31 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                }
              }
              local_f0 = (BYTE *)(uVar29 >> 3 & 0x1fffffff);
              if (*puVar26 == *puVar42) {
                puVar20 = (ulong *)((long)puVar19 + 0x11);
                puVar26 = puVar25 + 2;
                do {
                  if (puVar1 <= puVar20) goto LAB_00113232;
                  uVar29 = *puVar26;
                  uVar31 = *puVar20;
                  uVar36 = uVar31 ^ uVar29;
                  uVar35 = 0;
                  if (uVar36 != 0) {
                    for (; (uVar36 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                    }
                  }
                  local_f0 = (BYTE *)((long)puVar20 + ((uVar35 >> 3 & 0x1fffffff) - (long)puVar42));
                  puVar20 = puVar20 + 1;
                  puVar26 = puVar26 + 1;
                } while (uVar29 == uVar31);
              }
            }
            else {
LAB_00113232:
              if ((puVar20 < puVar2) && ((int)*puVar26 == (int)*puVar20)) {
                puVar20 = (ulong *)((long)puVar20 + 4);
                puVar26 = (ulong *)((long)puVar26 + 4);
              }
              if ((puVar20 < puVar3) && ((short)*puVar26 == (short)*puVar20)) {
                puVar20 = (ulong *)((long)puVar20 + 2);
                puVar26 = (ulong *)((long)puVar26 + 2);
              }
              if (puVar20 < puVar6) {
                puVar20 = (ulong *)((long)puVar20 + (ulong)((BYTE)*puVar26 == (BYTE)*puVar20));
              }
              local_f0 = (BYTE *)((long)puVar20 - (long)puVar42);
            }
            local_f0 = local_f0 + 8;
            local_50 = (int)puVar25;
            local_80 = (BYTE *)(ulong)(uint)((int)puVar27 - local_50);
            iVar41 = 7;
            puVar42 = puVar27;
            if ((uVar18 < uVar38) && (src < puVar27)) {
              pBVar40 = pBVar24 + uVar38;
              while (puVar42 = puVar19, (BYTE)*puVar42 == *pBVar40) {
                local_f0 = local_f0 + 1;
                if ((pBVar40 <= pBVar39) ||
                   (pBVar40 = pBVar40 + -1, puVar19 = (ulong *)((long)puVar42 + -1), puVar42 <= src)
                   ) goto LAB_00113318;
              }
              puVar42 = (ulong *)((long)puVar42 + 1);
            }
          }
LAB_00113318:
          if (iVar41 != 7) {
            if (iVar41 != 0) goto LAB_001138b5;
            puVar19 = (ulong *)((long)puVar42 + 4);
            puVar27 = (ulong *)(piVar32 + 1);
            puVar25 = puVar19;
            if (puVar19 < puVar1) {
              uVar29 = *puVar19 ^ *puVar27;
              uVar44 = 0;
              if (uVar29 != 0) {
                for (; (uVar29 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                }
              }
              pBVar40 = (BYTE *)(uVar44 >> 3 & 0x1fffffff);
              if (*puVar27 == *puVar19) {
                puVar25 = (ulong *)((long)puVar42 + 0xc);
                puVar27 = (ulong *)(piVar32 + 3);
                do {
                  if (puVar1 <= puVar25) goto LAB_001133ce;
                  uVar44 = *puVar27;
                  uVar29 = *puVar25;
                  uVar35 = uVar29 ^ uVar44;
                  uVar31 = 0;
                  if (uVar35 != 0) {
                    for (; (uVar35 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                    }
                  }
                  pBVar40 = (BYTE *)((long)puVar25 + ((uVar31 >> 3 & 0x1fffffff) - (long)puVar19));
                  puVar25 = puVar25 + 1;
                  puVar27 = puVar27 + 1;
                } while (uVar44 == uVar29);
              }
            }
            else {
LAB_001133ce:
              if ((puVar25 < puVar2) && ((int)*puVar27 == (int)*puVar25)) {
                puVar25 = (ulong *)((long)puVar25 + 4);
                puVar27 = (ulong *)((long)puVar27 + 4);
              }
              if ((puVar25 < puVar3) && ((short)*puVar27 == (short)*puVar25)) {
                puVar25 = (ulong *)((long)puVar25 + 2);
                puVar27 = (ulong *)((long)puVar27 + 2);
              }
              if (puVar25 < puVar6) {
                puVar25 = (ulong *)((long)puVar25 + (ulong)((BYTE)*puVar27 == (BYTE)*puVar25));
              }
              pBVar40 = (BYTE *)((long)puVar25 - (long)puVar19);
            }
            local_f0 = pBVar40 + 4;
            local_60 = (int)piVar32;
            local_80 = (BYTE *)(ulong)(uint)((int)puVar42 - local_60);
            if ((uVar18 < uVar28) && (src < puVar42)) {
              pBVar40 = pBVar24 + uVar28;
              puVar42 = (ulong *)((long)puVar42 + -1);
              do {
                if ((BYTE)*puVar42 != *pBVar40) goto LAB_00113485;
                local_f0 = local_f0 + 1;
                puVar19 = (ulong *)((long)puVar42 + -1);
              } while ((pBVar39 < pBVar40) &&
                      (pBVar40 = pBVar40 + -1, bVar15 = src < puVar42, puVar42 = puVar19, bVar15));
              goto LAB_00113227;
            }
          }
          goto LAB_0011348b;
        }
        puVar42 = (ulong *)((long)puVar19 + ((long)puVar19 - (long)src >> 8) + 1);
        goto LAB_001138b5;
      }
      puVar25 = (ulong *)((long)puVar19 + 5);
      puVar26 = (ulong *)((long)puVar19 + (5 - uVar31));
      puVar20 = puVar25;
      if (puVar25 < puVar1) {
        uVar35 = *puVar25 ^ *puVar26;
        uVar29 = 0;
        if (uVar35 != 0) {
          for (; (uVar35 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
          }
        }
        pBVar40 = (BYTE *)(uVar29 >> 3 & 0x1fffffff);
        if (*puVar26 == *puVar25) {
          puVar20 = (ulong *)((long)puVar19 + 0xd);
          puVar26 = (ulong *)((long)puVar19 + (0xd - uVar31));
          do {
            if (puVar1 <= puVar20) goto LAB_00112fd5;
            uVar29 = *puVar26;
            uVar31 = *puVar20;
            uVar36 = uVar31 ^ uVar29;
            uVar35 = 0;
            if (uVar36 != 0) {
              for (; (uVar36 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
              }
            }
            pBVar40 = (BYTE *)((long)puVar20 + ((uVar35 >> 3 & 0x1fffffff) - (long)puVar25));
            puVar20 = puVar20 + 1;
            puVar26 = puVar26 + 1;
          } while (uVar29 == uVar31);
        }
      }
      else {
LAB_00112fd5:
        if ((puVar20 < puVar2) && ((int)*puVar26 == (int)*puVar20)) {
          puVar20 = (ulong *)((long)puVar20 + 4);
          puVar26 = (ulong *)((long)puVar26 + 4);
        }
        if ((puVar20 < puVar3) && ((short)*puVar26 == (short)*puVar20)) {
          puVar20 = (ulong *)((long)puVar20 + 2);
          puVar26 = (ulong *)((long)puVar26 + 2);
        }
        if (puVar20 < puVar6) {
          puVar20 = (ulong *)((long)puVar20 + (ulong)((BYTE)*puVar26 == (BYTE)*puVar20));
        }
        pBVar40 = (BYTE *)((long)puVar20 - (long)puVar25);
      }
      if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
          seqStore->maxNbSeq) {
        if (seqStore->maxNbLit < 0x20001) {
          uVar29 = (long)puVar27 - (long)src;
          puVar19 = (ulong *)seqStore->lit;
          if ((BYTE *)((long)puVar19 + uVar29) <= seqStore->litStart + seqStore->maxNbLit) {
            if (puVar6 < puVar27) goto LAB_00115d85;
            if (puVar4 < puVar27) {
              ZSTD_safecopyLiterals((BYTE *)puVar19,(BYTE *)src,(BYTE *)puVar27,(BYTE *)puVar4);
            }
            else {
              uVar31 = *(ulong *)((long)src + 8);
              *puVar19 = *src;
              puVar19[1] = uVar31;
              if (0x10 < uVar29) {
                pBVar14 = seqStore->lit;
                puVar19 = (ulong *)(pBVar14 + 0x10);
                puVar27 = (ulong *)((long)src + 0x10);
                if (0xffffffffffffffe8 < (ulong)((long)puVar19 + (-8 - (long)puVar27)))
                goto LAB_00115e20;
                if (0xffffffffffffffe0 < (ulong)((long)puVar19 + (-0x10 - (long)puVar27)))
                goto LAB_00115e3f;
                uVar31 = *(ulong *)((long)src + 0x18);
                *puVar19 = *puVar27;
                *(ulong *)(pBVar14 + 0x18) = uVar31;
                if (0x20 < (long)uVar29) {
                  lVar34 = 0;
                  do {
                    puVar9 = (undefined8 *)((long)src + lVar34 + 0x20);
                    uVar16 = puVar9[1];
                    pBVar7 = pBVar14 + lVar34 + 0x20;
                    *(undefined8 *)pBVar7 = *puVar9;
                    *(undefined8 *)(pBVar7 + 8) = uVar16;
                    puVar9 = (undefined8 *)((long)src + lVar34 + 0x30);
                    uVar16 = puVar9[1];
                    *(undefined8 *)(pBVar7 + 0x10) = *puVar9;
                    *(undefined8 *)(pBVar7 + 0x18) = uVar16;
                    lVar34 = lVar34 + 0x20;
                  } while (pBVar7 + 0x20 < pBVar14 + uVar29);
                }
              }
            }
            seqStore->lit = seqStore->lit + uVar29;
            if (0xffff < uVar29) {
              if (seqStore->longLengthID != 0) goto LAB_00115e01;
              seqStore->longLengthID = 1;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
            local_f0 = pBVar40 + 4;
            pBVar40 = pBVar40 + 1;
            psVar21 = *ppsVar5;
            psVar21->litLength = (U16)uVar29;
            psVar21->offset = 1;
            uVar38 = local_fc;
            if (pBVar40 < (BYTE *)0x10000) goto LAB_00113611;
            if (seqStore->longLengthID == 0) goto LAB_001135f3;
            goto LAB_00115de2;
          }
          goto LAB_00115d66;
        }
        goto LAB_00115dc3;
      }
      goto LAB_00115da4;
    }
  }
  else if (puVar19 < puVar8) {
    bVar22 = 0x40 - (char)(ms->cParams).hashLog;
    bVar23 = 0x20 - (char)(ms->cParams).chainLog;
    puVar1 = (ulong *)((long)puVar6 + -7);
    puVar2 = (ulong *)((long)puVar6 + -3);
    puVar3 = (ulong *)((long)puVar6 + -1);
    puVar4 = puVar6 + -4;
    ppsVar5 = &seqStore->sequences;
    pBVar24 = pBVar11 + -1;
    local_b8 = pBVar24;
LAB_00115195:
    uVar29 = *puVar19 * -0x30e44323485a9b9d >> (bVar22 & 0x3f);
    uVar33 = (uint)((int)*puVar19 * -0x61c8864f) >> (bVar23 & 0x1f);
    UVar43 = (int)puVar19 - iVar37;
    uVar38 = pUVar12[uVar29];
    uVar28 = pUVar13[uVar33];
    pUVar13[uVar33] = UVar43;
    pUVar12[uVar29] = UVar43;
    puVar27 = (ulong *)((long)puVar19 + 1);
    if ((local_fc == 0) ||
       (uVar29 = (ulong)local_fc, *(int *)((long)puVar27 - uVar29) != *(int *)((long)puVar19 + 1)))
    {
      if ((uVar18 < uVar38) && (puVar42 = (ulong *)(pBVar11 + uVar38), *puVar42 == *puVar19)) {
        puVar27 = puVar19 + 1;
        puVar20 = puVar42 + 1;
        puVar25 = puVar27;
        if (puVar27 < puVar1) {
          uVar29 = *puVar27 ^ *puVar20;
          uVar44 = 0;
          if (uVar29 != 0) {
            for (; (uVar29 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
            }
          }
          pBVar40 = (BYTE *)(uVar44 >> 3 & 0x1fffffff);
          if (*puVar20 == *puVar27) {
            puVar25 = puVar19 + 2;
            puVar20 = puVar42 + 2;
            do {
              if (puVar1 <= puVar25) goto LAB_0011560d;
              uVar44 = *puVar20;
              uVar29 = *puVar25;
              uVar35 = uVar29 ^ uVar44;
              uVar31 = 0;
              if (uVar35 != 0) {
                for (; (uVar35 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                }
              }
              pBVar40 = (BYTE *)((long)puVar25 + ((uVar31 >> 3 & 0x1fffffff) - (long)puVar27));
              puVar25 = puVar25 + 1;
              puVar20 = puVar20 + 1;
            } while (uVar44 == uVar29);
          }
        }
        else {
LAB_0011560d:
          if ((puVar25 < puVar2) && ((int)*puVar20 == (int)*puVar25)) {
            puVar25 = (ulong *)((long)puVar25 + 4);
            puVar20 = (ulong *)((long)puVar20 + 4);
          }
          if ((puVar25 < puVar3) && ((short)*puVar20 == (short)*puVar25)) {
            puVar25 = (ulong *)((long)puVar25 + 2);
            puVar20 = (ulong *)((long)puVar20 + 2);
          }
          if (puVar25 < puVar6) {
            puVar25 = (ulong *)((long)puVar25 + (ulong)((BYTE)*puVar20 == (BYTE)*puVar25));
          }
          pBVar40 = (BYTE *)((long)puVar25 - (long)puVar27);
        }
        unaff_RBX = pBVar40 + 8;
        local_b8 = (BYTE *)(ulong)(uint)((int)puVar19 - (int)puVar42);
        puVar27 = puVar19;
        if ((uVar18 < uVar38) && (src < puVar19)) {
          pBVar40 = pBVar24 + uVar38;
          puVar19 = (ulong *)((long)puVar19 + -1);
          do {
            if ((BYTE)*puVar19 != *pBVar40) goto LAB_001158cd;
            unaff_RBX = unaff_RBX + 1;
            puVar27 = (ulong *)((long)puVar19 + -1);
          } while ((pBVar39 < pBVar40) &&
                  (pBVar40 = pBVar40 + -1, bVar15 = src < puVar19, puVar19 = puVar27, bVar15));
LAB_001156a6:
          puVar27 = (ulong *)((long)puVar27 + 1);
        }
        goto LAB_001158d3;
      }
      if ((uVar18 < uVar28) && (piVar32 = (int *)(pBVar11 + uVar28), *piVar32 == (int)*puVar19)) {
        uVar29 = *puVar27;
        uVar31 = uVar29 * -0x30e44323485a9b9d >> (bVar22 & 0x3f);
        uVar38 = pUVar12[uVar31];
        pUVar12[uVar31] = UVar43 + 1;
        iVar41 = 0;
        puVar42 = puVar19;
        if ((uVar18 < uVar38) && (puVar25 = (ulong *)(pBVar11 + uVar38), *puVar25 == uVar29)) {
          puVar42 = (ulong *)((long)puVar19 + 9);
          puVar20 = puVar25 + 1;
          puVar26 = puVar42;
          if (puVar42 < puVar1) {
            uVar31 = *puVar42 ^ *puVar20;
            uVar29 = 0;
            if (uVar31 != 0) {
              for (; (uVar31 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
              }
            }
            pBVar40 = (BYTE *)(uVar29 >> 3 & 0x1fffffff);
            if (*puVar20 == *puVar42) {
              puVar26 = (ulong *)((long)puVar19 + 0x11);
              puVar20 = puVar25 + 2;
              do {
                if (puVar1 <= puVar26) goto LAB_001156bf;
                uVar29 = *puVar20;
                uVar31 = *puVar26;
                uVar36 = uVar31 ^ uVar29;
                uVar35 = 0;
                if (uVar36 != 0) {
                  for (; (uVar36 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                  }
                }
                pBVar40 = (BYTE *)((long)puVar26 + ((uVar35 >> 3 & 0x1fffffff) - (long)puVar42));
                puVar26 = puVar26 + 1;
                puVar20 = puVar20 + 1;
              } while (uVar29 == uVar31);
            }
          }
          else {
LAB_001156bf:
            if ((puVar26 < puVar2) && ((int)*puVar20 == (int)*puVar26)) {
              puVar26 = (ulong *)((long)puVar26 + 4);
              puVar20 = (ulong *)((long)puVar20 + 4);
            }
            if ((puVar26 < puVar3) && ((short)*puVar20 == (short)*puVar26)) {
              puVar26 = (ulong *)((long)puVar26 + 2);
              puVar20 = (ulong *)((long)puVar20 + 2);
            }
            if (puVar26 < puVar6) {
              puVar26 = (ulong *)((long)puVar26 + (ulong)((BYTE)*puVar20 == (BYTE)*puVar26));
            }
            pBVar40 = (BYTE *)((long)puVar26 - (long)puVar42);
          }
          unaff_RBX = pBVar40 + 8;
          local_88 = (int)puVar25;
          local_b8 = (BYTE *)(ulong)(uint)((int)puVar27 - local_88);
          iVar41 = 7;
          puVar42 = puVar27;
          if ((uVar18 < uVar38) && (src < puVar27)) {
            pBVar40 = pBVar24 + uVar38;
            while (puVar42 = puVar19, (BYTE)*puVar42 == *pBVar40) {
              unaff_RBX = unaff_RBX + 1;
              if ((pBVar40 <= pBVar39) ||
                 (pBVar40 = pBVar40 + -1, puVar19 = (ulong *)((long)puVar42 + -1), puVar42 <= src))
              goto LAB_00115778;
            }
            puVar42 = (ulong *)((long)puVar42 + 1);
          }
        }
LAB_00115778:
        puVar27 = puVar42;
        if (iVar41 != 7) {
          if (iVar41 != 0) goto LAB_00115d05;
          puVar19 = (ulong *)((long)puVar42 + 4);
          puVar20 = (ulong *)(piVar32 + 1);
          puVar25 = puVar19;
          if (puVar19 < puVar1) {
            uVar29 = *puVar19 ^ *puVar20;
            uVar44 = 0;
            if (uVar29 != 0) {
              for (; (uVar29 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
              }
            }
            pBVar40 = (BYTE *)(uVar44 >> 3 & 0x1fffffff);
            if (*puVar20 == *puVar19) {
              puVar25 = (ulong *)((long)puVar42 + 0xc);
              puVar20 = (ulong *)(piVar32 + 3);
              do {
                if (puVar1 <= puVar25) goto LAB_00115832;
                uVar44 = *puVar20;
                uVar29 = *puVar25;
                uVar35 = uVar29 ^ uVar44;
                uVar31 = 0;
                if (uVar35 != 0) {
                  for (; (uVar35 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                  }
                }
                pBVar40 = (BYTE *)((long)puVar25 + ((uVar31 >> 3 & 0x1fffffff) - (long)puVar19));
                puVar25 = puVar25 + 1;
                puVar20 = puVar20 + 1;
              } while (uVar44 == uVar29);
            }
          }
          else {
LAB_00115832:
            if ((puVar25 < puVar2) && ((int)*puVar20 == (int)*puVar25)) {
              puVar25 = (ulong *)((long)puVar25 + 4);
              puVar20 = (ulong *)((long)puVar20 + 4);
            }
            if ((puVar25 < puVar3) && ((short)*puVar20 == (short)*puVar25)) {
              puVar25 = (ulong *)((long)puVar25 + 2);
              puVar20 = (ulong *)((long)puVar20 + 2);
            }
            if (puVar25 < puVar6) {
              puVar25 = (ulong *)((long)puVar25 + (ulong)((BYTE)*puVar20 == (BYTE)*puVar25));
            }
            pBVar40 = (BYTE *)((long)puVar25 - (long)puVar19);
          }
          unaff_RBX = pBVar40 + 4;
          local_e8 = (int)piVar32;
          local_b8 = (BYTE *)(ulong)(uint)((int)puVar42 - local_e8);
          if ((uVar18 < uVar28) && (src < puVar42)) {
            pBVar40 = pBVar24 + uVar28;
            puVar19 = (ulong *)((long)puVar42 + -1);
            do {
              if ((BYTE)*puVar19 != *pBVar40) goto LAB_001158cd;
              unaff_RBX = unaff_RBX + 1;
              puVar27 = (ulong *)((long)puVar19 + -1);
            } while ((pBVar39 < pBVar40) &&
                    (pBVar40 = pBVar40 + -1, bVar15 = src < puVar19, puVar19 = puVar27, bVar15));
            goto LAB_001156a6;
          }
        }
        goto LAB_001158d3;
      }
      puVar42 = (ulong *)((long)puVar19 + ((long)puVar19 - (long)src >> 8) + 1);
      goto LAB_00115d05;
    }
    puVar42 = (ulong *)((long)puVar19 + 5);
    puVar20 = (ulong *)((long)puVar19 + (5 - uVar29));
    puVar25 = puVar42;
    if (puVar42 < puVar1) {
      uVar35 = *puVar42 ^ *puVar20;
      uVar31 = 0;
      if (uVar35 != 0) {
        for (; (uVar35 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
        }
      }
      pBVar40 = (BYTE *)(uVar31 >> 3 & 0x1fffffff);
      if (*puVar20 == *puVar42) {
        puVar25 = (ulong *)((long)puVar19 + 0xd);
        puVar20 = (ulong *)((long)puVar19 + (0xd - uVar29));
        do {
          if (puVar1 <= puVar25) goto LAB_00115460;
          uVar29 = *puVar20;
          uVar31 = *puVar25;
          uVar36 = uVar31 ^ uVar29;
          uVar35 = 0;
          if (uVar36 != 0) {
            for (; (uVar36 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
            }
          }
          pBVar40 = (BYTE *)((long)puVar25 + ((uVar35 >> 3 & 0x1fffffff) - (long)puVar42));
          puVar25 = puVar25 + 1;
          puVar20 = puVar20 + 1;
        } while (uVar29 == uVar31);
      }
    }
    else {
LAB_00115460:
      if ((puVar25 < puVar2) && ((int)*puVar20 == (int)*puVar25)) {
        puVar25 = (ulong *)((long)puVar25 + 4);
        puVar20 = (ulong *)((long)puVar20 + 4);
      }
      if ((puVar25 < puVar3) && ((short)*puVar20 == (short)*puVar25)) {
        puVar25 = (ulong *)((long)puVar25 + 2);
        puVar20 = (ulong *)((long)puVar20 + 2);
      }
      if (puVar25 < puVar6) {
        puVar25 = (ulong *)((long)puVar25 + (ulong)((BYTE)*puVar20 == (BYTE)*puVar25));
      }
      pBVar40 = (BYTE *)((long)puVar25 - (long)puVar42);
    }
    if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
        seqStore->maxNbSeq) {
      if (seqStore->maxNbLit < 0x20001) {
        uVar29 = (long)puVar27 - (long)src;
        puVar19 = (ulong *)seqStore->lit;
        if ((BYTE *)((long)puVar19 + uVar29) <= seqStore->litStart + seqStore->maxNbLit) {
          if (puVar6 < puVar27) goto LAB_00115d85;
          if (puVar4 < puVar27) {
            ZSTD_safecopyLiterals((BYTE *)puVar19,(BYTE *)src,(BYTE *)puVar27,(BYTE *)puVar4);
          }
          else {
            uVar31 = *(ulong *)((long)src + 8);
            *puVar19 = *src;
            puVar19[1] = uVar31;
            if (0x10 < uVar29) {
              pBVar14 = seqStore->lit;
              puVar19 = (ulong *)(pBVar14 + 0x10);
              puVar42 = (ulong *)((long)src + 0x10);
              if (0xffffffffffffffe8 < (ulong)((long)puVar19 + (-8 - (long)puVar42)))
              goto LAB_00115e20;
              if (0xffffffffffffffe0 < (ulong)((long)puVar19 + (-0x10 - (long)puVar42)))
              goto LAB_00115e3f;
              uVar31 = *(ulong *)((long)src + 0x18);
              *puVar19 = *puVar42;
              *(ulong *)(pBVar14 + 0x18) = uVar31;
              if (0x20 < (long)uVar29) {
                lVar34 = 0;
                do {
                  puVar9 = (undefined8 *)((long)src + lVar34 + 0x20);
                  uVar16 = puVar9[1];
                  pBVar7 = pBVar14 + lVar34 + 0x20;
                  *(undefined8 *)pBVar7 = *puVar9;
                  *(undefined8 *)(pBVar7 + 8) = uVar16;
                  puVar9 = (undefined8 *)((long)src + lVar34 + 0x30);
                  uVar16 = puVar9[1];
                  *(undefined8 *)(pBVar7 + 0x10) = *puVar9;
                  *(undefined8 *)(pBVar7 + 0x18) = uVar16;
                  lVar34 = lVar34 + 0x20;
                } while (pBVar7 + 0x20 < pBVar14 + uVar29);
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar29;
          if (0xffff < uVar29) {
            if (seqStore->longLengthID != 0) goto LAB_00115e01;
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          unaff_RBX = pBVar40 + 4;
          pBVar40 = pBVar40 + 1;
          psVar21 = *ppsVar5;
          psVar21->litLength = (U16)uVar29;
          psVar21->offset = 1;
          if (pBVar40 < (BYTE *)0x10000) goto LAB_00115a68;
          uVar38 = local_fc;
          if (seqStore->longLengthID == 0) goto LAB_00115a45;
          goto LAB_00115de2;
        }
        goto LAB_00115d66;
      }
      goto LAB_00115dc3;
    }
    goto LAB_00115da4;
  }
LAB_00115d10:
  uVar18 = 0;
  if (uVar30 < uVar17) {
    uVar18 = uVar17;
  }
  if (uVar30 < uVar10) {
    uVar18 = uVar10;
  }
  if (local_fc == 0) {
    local_fc = uVar18;
  }
  if (uVar38 != 0) {
    uVar18 = uVar38;
  }
  *rep = local_fc;
  rep[1] = uVar18;
  return (long)puVar6 - (long)src;
LAB_00114cda:
  puVar27 = (ulong *)((long)puVar19 + 1);
LAB_00114ce0:
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_00115da4;
  if (0x20000 < seqStore->maxNbLit) goto LAB_00115dc3;
  uVar44 = (long)puVar27 - (long)src;
  puVar19 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar19 + uVar44)) goto LAB_00115d66;
  if (puVar6 < puVar27) goto LAB_00115d85;
  if (puVar4 < puVar27) {
    ZSTD_safecopyLiterals((BYTE *)puVar19,(BYTE *)src,(BYTE *)puVar27,(BYTE *)puVar4);
  }
  else {
    uVar29 = *(ulong *)((long)src + 8);
    *puVar19 = *src;
    puVar19[1] = uVar29;
    if (0x10 < uVar44) {
      pBVar40 = seqStore->lit;
      puVar19 = (ulong *)(pBVar40 + 0x10);
      puVar42 = (ulong *)((long)src + 0x10);
      if (0xffffffffffffffe8 < (ulong)((long)puVar19 + (-8 - (long)puVar42))) goto LAB_00115e20;
      if (0xffffffffffffffe0 < (ulong)((long)puVar19 + (-0x10 - (long)puVar42))) goto LAB_00115e3f;
      uVar29 = *(ulong *)((long)src + 0x18);
      *puVar19 = *puVar42;
      *(ulong *)(pBVar40 + 0x18) = uVar29;
      if (0x20 < (long)uVar44) {
        lVar34 = 0;
        do {
          puVar9 = (undefined8 *)((long)src + lVar34 + 0x20);
          uVar16 = puVar9[1];
          pBVar14 = pBVar40 + lVar34 + 0x20;
          *(undefined8 *)pBVar14 = *puVar9;
          *(undefined8 *)(pBVar14 + 8) = uVar16;
          puVar9 = (undefined8 *)((long)src + lVar34 + 0x30);
          uVar16 = puVar9[1];
          *(undefined8 *)(pBVar14 + 0x10) = *puVar9;
          *(undefined8 *)(pBVar14 + 0x18) = uVar16;
          lVar34 = lVar34 + 0x20;
        } while (pBVar14 + 0x20 < pBVar40 + uVar44);
      }
    }
  }
  seqStore->lit = seqStore->lit + uVar44;
  if (0xffff < uVar44) {
    if (seqStore->longLengthID != 0) goto LAB_00115e01;
    seqStore->longLengthID = 1;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
  pBVar40 = unaff_R13 + -3;
  psVar21 = *ppsVar5;
  psVar21->litLength = (U16)uVar44;
  uVar38 = (uint)local_90;
  psVar21->offset = uVar38 + 3;
  if (pBVar40 < (BYTE *)0x10000) {
    uVar44 = (ulong)local_fc;
  }
  else {
    uVar44 = (ulong)local_fc;
    if (seqStore->longLengthID != 0) goto LAB_00115de2;
LAB_00114e43:
    seqStore->longLengthID = 2;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar21 - (long)seqStore->sequencesStart) >> 3);
  }
LAB_00114e5f:
  psVar21->matchLength = (U16)pBVar40;
  *ppsVar5 = psVar21 + 1;
  puVar42 = (ulong *)((long)puVar27 + (long)unaff_R13);
  src = puVar42;
  local_fc = uVar38;
  if (puVar42 <= puVar8) {
    uVar28 = UVar43 + 2;
    lVar34 = *(long *)(pBVar11 + uVar28);
    pUVar12[(ulong)(lVar34 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] = uVar28;
    pUVar12[(ulong)(*(long *)((long)puVar42 + -2) * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] =
         ((int)puVar42 + -2) - iVar37;
    pUVar13[(ulong)(lVar34 * -0x30e4432345000000) >> (bVar23 & 0x3f)] = uVar28;
    pUVar13[(ulong)(*(long *)((long)puVar42 + -1) * -0x30e4432345000000) >> (bVar23 & 0x3f)] =
         ((int)puVar42 + -1) - iVar37;
    do {
      uVar28 = (uint)uVar44;
      src = puVar42;
      local_fc = uVar38;
      if ((uVar28 == 0) || ((int)*puVar42 != *(int *)((long)puVar42 - uVar44))) break;
      puVar19 = (ulong *)((long)puVar42 + 4);
      puVar25 = (ulong *)((long)puVar42 + (4 - uVar44));
      puVar27 = puVar19;
      if (puVar19 < puVar1) {
        uVar31 = *puVar19 ^ *puVar25;
        uVar29 = 0;
        if (uVar31 != 0) {
          for (; (uVar31 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
          }
        }
        pBVar40 = (BYTE *)(uVar29 >> 3 & 0x1fffffff);
        if (*puVar25 == *puVar19) {
          puVar27 = (ulong *)((long)puVar42 + 0xc);
          puVar25 = (ulong *)((long)puVar42 + (0xc - uVar44));
          do {
            if (puVar1 <= puVar27) goto LAB_00114fad;
            uVar44 = *puVar25;
            uVar29 = *puVar27;
            uVar35 = uVar29 ^ uVar44;
            uVar31 = 0;
            if (uVar35 != 0) {
              for (; (uVar35 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
              }
            }
            pBVar40 = (BYTE *)((long)puVar27 + ((uVar31 >> 3 & 0x1fffffff) - (long)puVar19));
            puVar27 = puVar27 + 1;
            puVar25 = puVar25 + 1;
          } while (uVar44 == uVar29);
        }
      }
      else {
LAB_00114fad:
        if ((puVar27 < puVar2) && ((int)*puVar25 == (int)*puVar27)) {
          puVar27 = (ulong *)((long)puVar27 + 4);
          puVar25 = (ulong *)((long)puVar25 + 4);
        }
        if ((puVar27 < puVar3) && ((short)*puVar25 == (short)*puVar27)) {
          puVar27 = (ulong *)((long)puVar27 + 2);
          puVar25 = (ulong *)((long)puVar25 + 2);
        }
        if (puVar27 < puVar6) {
          puVar27 = (ulong *)((long)puVar27 + (ulong)((BYTE)*puVar25 == (BYTE)*puVar27));
        }
        pBVar40 = (BYTE *)((long)puVar27 - (long)puVar19);
      }
      uVar44 = *puVar42;
      UVar43 = (int)puVar42 - iVar37;
      pUVar13[uVar44 * -0x30e4432345000000 >> (bVar23 & 0x3f)] = UVar43;
      pUVar12[uVar44 * -0x30e44323485a9b9d >> (bVar22 & 0x3f)] = UVar43;
      if (seqStore->maxNbSeq <=
          (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
      goto LAB_00115da4;
      if (0x20000 < seqStore->maxNbLit) goto LAB_00115dc3;
      puVar19 = (ulong *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < puVar19) goto LAB_00115d66;
      if (puVar6 < puVar42) goto LAB_00115d85;
      if (puVar4 < puVar42) {
        ZSTD_safecopyLiterals((BYTE *)puVar19,(BYTE *)puVar42,(BYTE *)puVar42,(BYTE *)puVar4);
      }
      else {
        uVar44 = puVar42[1];
        *puVar19 = *puVar42;
        puVar19[1] = uVar44;
      }
      psVar21 = seqStore->sequences;
      psVar21->litLength = 0;
      psVar21->offset = 1;
      if ((BYTE *)0xffff < pBVar40 + 1) {
        if (seqStore->longLengthID != 0) goto LAB_00115de2;
        seqStore->longLengthID = 2;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar21 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar21->matchLength = (U16)(pBVar40 + 1);
      seqStore->sequences = psVar21 + 1;
      puVar42 = (ulong *)((long)puVar42 + (long)(pBVar40 + 4));
      uVar44 = (ulong)uVar38;
      src = puVar42;
      uVar38 = uVar28;
      local_fc = uVar28;
    } while (puVar42 <= puVar8);
  }
LAB_00115113:
  uVar38 = (uint)uVar44;
  puVar19 = puVar42;
  if (puVar8 <= puVar42) goto LAB_00115d10;
  goto LAB_0011458f;
LAB_001140e7:
  puVar27 = (ulong *)((long)puVar19 + 1);
LAB_001140ed:
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_00115da4;
  if (0x20000 < seqStore->maxNbLit) goto LAB_00115dc3;
  uVar44 = (long)puVar27 - (long)src;
  puVar19 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar19 + uVar44)) goto LAB_00115d66;
  if (puVar6 < puVar27) goto LAB_00115d85;
  if (puVar4 < puVar27) {
    ZSTD_safecopyLiterals((BYTE *)puVar19,(BYTE *)src,(BYTE *)puVar27,(BYTE *)puVar4);
  }
  else {
    uVar29 = *(ulong *)((long)src + 8);
    *puVar19 = *src;
    puVar19[1] = uVar29;
    if (0x10 < uVar44) {
      pBVar40 = seqStore->lit;
      puVar19 = (ulong *)(pBVar40 + 0x10);
      puVar42 = (ulong *)((long)src + 0x10);
      if (0xffffffffffffffe8 < (ulong)((long)puVar19 + (-8 - (long)puVar42))) goto LAB_00115e20;
      if (0xffffffffffffffe0 < (ulong)((long)puVar19 + (-0x10 - (long)puVar42))) goto LAB_00115e3f;
      uVar29 = *(ulong *)((long)src + 0x18);
      *puVar19 = *puVar42;
      *(ulong *)(pBVar40 + 0x18) = uVar29;
      if (0x20 < (long)uVar44) {
        lVar34 = 0;
        do {
          puVar9 = (undefined8 *)((long)src + lVar34 + 0x20);
          uVar16 = puVar9[1];
          pBVar14 = pBVar40 + lVar34 + 0x20;
          *(undefined8 *)pBVar14 = *puVar9;
          *(undefined8 *)(pBVar14 + 8) = uVar16;
          puVar9 = (undefined8 *)((long)src + lVar34 + 0x30);
          uVar16 = puVar9[1];
          *(undefined8 *)(pBVar14 + 0x10) = *puVar9;
          *(undefined8 *)(pBVar14 + 0x18) = uVar16;
          lVar34 = lVar34 + 0x20;
        } while (pBVar14 + 0x20 < pBVar40 + uVar44);
      }
    }
  }
  seqStore->lit = seqStore->lit + uVar44;
  if (0xffff < uVar44) {
    if (seqStore->longLengthID != 0) goto LAB_00115e01;
    seqStore->longLengthID = 1;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
  pBVar40 = local_f0 + -3;
  psVar21 = *ppsVar5;
  psVar21->litLength = (U16)uVar44;
  uVar38 = (uint)local_80;
  psVar21->offset = uVar38 + 3;
  if (pBVar40 < (BYTE *)0x10000) {
    uVar44 = (ulong)local_fc;
  }
  else {
    uVar44 = (ulong)local_fc;
    if (seqStore->longLengthID != 0) goto LAB_00115de2;
LAB_00114255:
    seqStore->longLengthID = 2;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar21 - (long)seqStore->sequencesStart) >> 3);
  }
LAB_00114273:
  psVar21->matchLength = (U16)pBVar40;
  *ppsVar5 = psVar21 + 1;
  puVar42 = (ulong *)((long)puVar27 + (long)local_f0);
  src = puVar42;
  local_fc = uVar38;
  if (puVar42 <= puVar8) {
    uVar28 = UVar43 + 2;
    lVar34 = *(long *)(pBVar11 + uVar28);
    pUVar12[(ulong)(lVar34 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] = uVar28;
    pUVar12[(ulong)(*(long *)((long)puVar42 + -2) * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] =
         ((int)puVar42 + -2) - iVar37;
    pUVar13[(ulong)(lVar34 * -0x30e4432340650000) >> (bVar23 & 0x3f)] = uVar28;
    pUVar13[(ulong)(*(long *)((long)puVar42 + -1) * -0x30e4432340650000) >> (bVar23 & 0x3f)] =
         ((int)puVar42 + -1) - iVar37;
    do {
      uVar28 = (uint)uVar44;
      src = puVar42;
      local_fc = uVar38;
      if ((uVar28 == 0) || ((int)*puVar42 != *(int *)((long)puVar42 - uVar44))) break;
      puVar19 = (ulong *)((long)puVar42 + 4);
      puVar25 = (ulong *)((long)puVar42 + (4 - uVar44));
      puVar27 = puVar19;
      if (puVar19 < puVar1) {
        uVar31 = *puVar19 ^ *puVar25;
        uVar29 = 0;
        if (uVar31 != 0) {
          for (; (uVar31 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
          }
        }
        pBVar40 = (BYTE *)(uVar29 >> 3 & 0x1fffffff);
        if (*puVar25 == *puVar19) {
          puVar27 = (ulong *)((long)puVar42 + 0xc);
          puVar25 = (ulong *)((long)puVar42 + (0xc - uVar44));
          do {
            if (puVar1 <= puVar27) goto LAB_001143b5;
            uVar44 = *puVar25;
            uVar29 = *puVar27;
            uVar35 = uVar29 ^ uVar44;
            uVar31 = 0;
            if (uVar35 != 0) {
              for (; (uVar35 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
              }
            }
            pBVar40 = (BYTE *)((long)puVar27 + ((uVar31 >> 3 & 0x1fffffff) - (long)puVar19));
            puVar27 = puVar27 + 1;
            puVar25 = puVar25 + 1;
          } while (uVar44 == uVar29);
        }
      }
      else {
LAB_001143b5:
        if ((puVar27 < puVar2) && ((int)*puVar25 == (int)*puVar27)) {
          puVar27 = (ulong *)((long)puVar27 + 4);
          puVar25 = (ulong *)((long)puVar25 + 4);
        }
        if ((puVar27 < puVar3) && ((short)*puVar25 == (short)*puVar27)) {
          puVar27 = (ulong *)((long)puVar27 + 2);
          puVar25 = (ulong *)((long)puVar25 + 2);
        }
        if (puVar27 < puVar6) {
          puVar27 = (ulong *)((long)puVar27 + (ulong)((BYTE)*puVar25 == (BYTE)*puVar27));
        }
        pBVar40 = (BYTE *)((long)puVar27 - (long)puVar19);
      }
      uVar44 = *puVar42;
      UVar43 = (int)puVar42 - iVar37;
      pUVar13[uVar44 * -0x30e4432340650000 >> (bVar23 & 0x3f)] = UVar43;
      pUVar12[uVar44 * -0x30e44323485a9b9d >> (bVar22 & 0x3f)] = UVar43;
      if (seqStore->maxNbSeq <=
          (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
      goto LAB_00115da4;
      if (0x20000 < seqStore->maxNbLit) goto LAB_00115dc3;
      puVar19 = (ulong *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < puVar19) goto LAB_00115d66;
      if (puVar6 < puVar42) goto LAB_00115d85;
      if (puVar4 < puVar42) {
        ZSTD_safecopyLiterals((BYTE *)puVar19,(BYTE *)puVar42,(BYTE *)puVar42,(BYTE *)puVar4);
      }
      else {
        uVar44 = puVar42[1];
        *puVar19 = *puVar42;
        puVar19[1] = uVar44;
      }
      psVar21 = seqStore->sequences;
      psVar21->litLength = 0;
      psVar21->offset = 1;
      if ((BYTE *)0xffff < pBVar40 + 1) {
        if (seqStore->longLengthID != 0) goto LAB_00115de2;
        seqStore->longLengthID = 2;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar21 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar21->matchLength = (U16)(pBVar40 + 1);
      seqStore->sequences = psVar21 + 1;
      puVar42 = (ulong *)((long)puVar42 + (long)(pBVar40 + 4));
      src = puVar42;
      uVar44 = (ulong)uVar38;
      uVar38 = uVar28;
      local_fc = uVar28;
    } while (puVar42 <= puVar8);
  }
LAB_00114517:
  uVar38 = (uint)uVar44;
  puVar19 = puVar42;
  if (puVar8 <= puVar42) goto LAB_00115d10;
  goto LAB_0011394f;
LAB_001158cd:
  puVar27 = (ulong *)((long)puVar19 + 1);
LAB_001158d3:
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_00115da4;
  if (0x20000 < seqStore->maxNbLit) goto LAB_00115dc3;
  uVar44 = (long)puVar27 - (long)src;
  puVar19 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar19 + uVar44)) goto LAB_00115d66;
  if (puVar6 < puVar27) goto LAB_00115d85;
  if (puVar4 < puVar27) {
    ZSTD_safecopyLiterals((BYTE *)puVar19,(BYTE *)src,(BYTE *)puVar27,(BYTE *)puVar4);
  }
  else {
    uVar29 = *(ulong *)((long)src + 8);
    *puVar19 = *src;
    puVar19[1] = uVar29;
    if (0x10 < uVar44) {
      pBVar40 = seqStore->lit;
      puVar19 = (ulong *)(pBVar40 + 0x10);
      puVar42 = (ulong *)((long)src + 0x10);
      if (0xffffffffffffffe8 < (ulong)((long)puVar19 + (-8 - (long)puVar42))) goto LAB_00115e20;
      if (0xffffffffffffffe0 < (ulong)((long)puVar19 + (-0x10 - (long)puVar42))) goto LAB_00115e3f;
      uVar29 = *(ulong *)((long)src + 0x18);
      *puVar19 = *puVar42;
      *(ulong *)(pBVar40 + 0x18) = uVar29;
      if (0x20 < (long)uVar44) {
        lVar34 = 0;
        do {
          puVar9 = (undefined8 *)((long)src + lVar34 + 0x20);
          uVar16 = puVar9[1];
          pBVar14 = pBVar40 + lVar34 + 0x20;
          *(undefined8 *)pBVar14 = *puVar9;
          *(undefined8 *)(pBVar14 + 8) = uVar16;
          puVar9 = (undefined8 *)((long)src + lVar34 + 0x30);
          uVar16 = puVar9[1];
          *(undefined8 *)(pBVar14 + 0x10) = *puVar9;
          *(undefined8 *)(pBVar14 + 0x18) = uVar16;
          lVar34 = lVar34 + 0x20;
        } while (pBVar14 + 0x20 < pBVar40 + uVar44);
      }
    }
  }
  seqStore->lit = seqStore->lit + uVar44;
  if (0xffff < uVar44) {
    if (seqStore->longLengthID != 0) goto LAB_00115e01;
    seqStore->longLengthID = 1;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
  pBVar40 = unaff_RBX + -3;
  psVar21 = *ppsVar5;
  psVar21->litLength = (U16)uVar44;
  uVar38 = (uint)local_b8;
  psVar21->offset = uVar38 + 3;
  if (pBVar40 < (BYTE *)0x10000) {
    uVar44 = (ulong)local_fc;
    local_fc = uVar38;
  }
  else {
    uVar44 = (ulong)local_fc;
    if (seqStore->longLengthID != 0) goto LAB_00115de2;
LAB_00115a45:
    seqStore->longLengthID = 2;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar21 - (long)seqStore->sequencesStart) >> 3);
    local_fc = uVar38;
  }
LAB_00115a68:
  psVar21->matchLength = (U16)pBVar40;
  *ppsVar5 = psVar21 + 1;
  puVar42 = (ulong *)((long)puVar27 + (long)unaff_RBX);
  src = puVar42;
  if (puVar42 <= puVar8) {
    uVar38 = UVar43 + 2;
    pUVar12[(ulong)(*(long *)(pBVar11 + uVar38) * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] = uVar38;
    pUVar12[(ulong)(*(long *)((long)puVar42 + -2) * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] =
         ((int)puVar42 + -2) - iVar37;
    pUVar13[(uint)(*(int *)(pBVar11 + uVar38) * -0x61c8864f) >> (bVar23 & 0x1f)] = uVar38;
    pUVar13[(uint)(*(int *)((long)puVar42 + -1) * -0x61c8864f) >> (bVar23 & 0x1f)] =
         ((int)puVar42 + -1) - iVar37;
    do {
      uVar38 = (uint)uVar44;
      src = puVar42;
      if ((uVar38 == 0) || ((int)*puVar42 != *(int *)((long)puVar42 - uVar44))) break;
      puVar19 = (ulong *)((long)puVar42 + 4);
      puVar25 = (ulong *)((long)puVar42 + (4 - uVar44));
      puVar27 = puVar19;
      if (puVar19 < puVar1) {
        uVar31 = *puVar19 ^ *puVar25;
        uVar29 = 0;
        if (uVar31 != 0) {
          for (; (uVar31 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
          }
        }
        pBVar40 = (BYTE *)(uVar29 >> 3 & 0x1fffffff);
        if (*puVar25 == *puVar19) {
          puVar27 = (ulong *)((long)puVar42 + 0xc);
          puVar25 = (ulong *)((long)puVar42 + (0xc - uVar44));
          do {
            if (puVar1 <= puVar27) goto LAB_00115ba4;
            uVar44 = *puVar25;
            uVar29 = *puVar27;
            uVar35 = uVar29 ^ uVar44;
            uVar31 = 0;
            if (uVar35 != 0) {
              for (; (uVar35 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
              }
            }
            pBVar40 = (BYTE *)((long)puVar27 + ((uVar31 >> 3 & 0x1fffffff) - (long)puVar19));
            puVar27 = puVar27 + 1;
            puVar25 = puVar25 + 1;
          } while (uVar44 == uVar29);
        }
      }
      else {
LAB_00115ba4:
        if ((puVar27 < puVar2) && ((int)*puVar25 == (int)*puVar27)) {
          puVar27 = (ulong *)((long)puVar27 + 4);
          puVar25 = (ulong *)((long)puVar25 + 4);
        }
        if ((puVar27 < puVar3) && ((short)*puVar25 == (short)*puVar27)) {
          puVar27 = (ulong *)((long)puVar27 + 2);
          puVar25 = (ulong *)((long)puVar25 + 2);
        }
        if (puVar27 < puVar6) {
          puVar27 = (ulong *)((long)puVar27 + (ulong)((BYTE)*puVar25 == (BYTE)*puVar27));
        }
        pBVar40 = (BYTE *)((long)puVar27 - (long)puVar19);
      }
      UVar43 = (int)puVar42 - iVar37;
      pUVar13[(uint)((int)*puVar42 * -0x61c8864f) >> (bVar23 & 0x1f)] = UVar43;
      pUVar12[*puVar42 * -0x30e44323485a9b9d >> (bVar22 & 0x3f)] = UVar43;
      if (seqStore->maxNbSeq <=
          (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
      goto LAB_00115da4;
      if (0x20000 < seqStore->maxNbLit) goto LAB_00115dc3;
      puVar19 = (ulong *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < puVar19) goto LAB_00115d66;
      if (puVar6 < puVar42) goto LAB_00115d85;
      if (puVar4 < puVar42) {
        ZSTD_safecopyLiterals((BYTE *)puVar19,(BYTE *)puVar42,(BYTE *)puVar42,(BYTE *)puVar4);
      }
      else {
        uVar44 = puVar42[1];
        *puVar19 = *puVar42;
        puVar19[1] = uVar44;
      }
      psVar21 = seqStore->sequences;
      psVar21->litLength = 0;
      psVar21->offset = 1;
      if ((BYTE *)0xffff < pBVar40 + 1) {
        if (seqStore->longLengthID != 0) goto LAB_00115de2;
        seqStore->longLengthID = 2;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar21 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar21->matchLength = (U16)(pBVar40 + 1);
      seqStore->sequences = psVar21 + 1;
      puVar42 = (ulong *)((long)puVar42 + (long)(pBVar40 + 4));
      src = puVar42;
      uVar44 = (ulong)local_fc;
      local_fc = uVar38;
    } while (puVar42 <= puVar8);
  }
LAB_00115d05:
  uVar38 = (uint)uVar44;
  puVar19 = puVar42;
  if (puVar8 <= puVar42) goto LAB_00115d10;
  goto LAB_00115195;
LAB_00113485:
  puVar42 = (ulong *)((long)puVar42 + 1);
LAB_0011348b:
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) {
LAB_00115da4:
    __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x2038,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (0x20000 < seqStore->maxNbLit) {
LAB_00115dc3:
    __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x203a,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  uVar44 = (long)puVar42 - (long)src;
  puVar19 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar19 + uVar44)) {
LAB_00115d66:
    __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x203b,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (puVar6 < puVar42) {
LAB_00115d85:
    __assert_fail("literals + litLength <= litLimit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x203c,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (puVar4 < puVar42) {
    ZSTD_safecopyLiterals((BYTE *)puVar19,(BYTE *)src,(BYTE *)puVar42,(BYTE *)puVar4);
  }
  else {
    uVar29 = *(ulong *)((long)src + 8);
    *puVar19 = *src;
    puVar19[1] = uVar29;
    if (0x10 < uVar44) {
      pBVar40 = seqStore->lit;
      puVar19 = (ulong *)(pBVar40 + 0x10);
      puVar27 = (ulong *)((long)src + 0x10);
      if (0xffffffffffffffe8 < (ulong)((long)puVar19 + (-8 - (long)puVar27))) {
LAB_00115e20:
        __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x1268,
                      "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)");
      }
      if (0xffffffffffffffe0 < (ulong)((long)puVar19 + (-0x10 - (long)puVar27))) {
LAB_00115e3f:
        __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x1270,
                      "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)");
      }
      uVar29 = *(ulong *)((long)src + 0x18);
      *puVar19 = *puVar27;
      *(ulong *)(pBVar40 + 0x18) = uVar29;
      if (0x20 < (long)uVar44) {
        lVar34 = 0;
        do {
          puVar9 = (undefined8 *)((long)src + lVar34 + 0x20);
          uVar16 = puVar9[1];
          pBVar14 = pBVar40 + lVar34 + 0x20;
          *(undefined8 *)pBVar14 = *puVar9;
          *(undefined8 *)(pBVar14 + 8) = uVar16;
          puVar9 = (undefined8 *)((long)src + lVar34 + 0x30);
          uVar16 = puVar9[1];
          *(undefined8 *)(pBVar14 + 0x10) = *puVar9;
          *(undefined8 *)(pBVar14 + 0x18) = uVar16;
          lVar34 = lVar34 + 0x20;
        } while (pBVar14 + 0x20 < pBVar40 + uVar44);
      }
    }
  }
  seqStore->lit = seqStore->lit + uVar44;
  if (0xffff < uVar44) {
    if (seqStore->longLengthID != 0) {
LAB_00115e01:
      __assert_fail("seqStorePtr->longLengthID == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x204d,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    seqStore->longLengthID = 1;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
  pBVar40 = local_f0 + -3;
  psVar21 = *ppsVar5;
  psVar21->litLength = (U16)uVar44;
  uVar38 = (uint)local_80;
  psVar21->offset = uVar38 + 3;
  if (pBVar40 < (BYTE *)0x10000) {
    uVar44 = (ulong)local_fc;
  }
  else {
    uVar44 = (ulong)local_fc;
    if (seqStore->longLengthID != 0) {
LAB_00115de2:
      __assert_fail("seqStorePtr->longLengthID == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x2058,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
LAB_001135f3:
    seqStore->longLengthID = 2;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar21 - (long)seqStore->sequencesStart) >> 3);
  }
LAB_00113611:
  psVar21->matchLength = (U16)pBVar40;
  *ppsVar5 = psVar21 + 1;
  puVar42 = (ulong *)((long)puVar42 + (long)local_f0);
  src = puVar42;
  local_fc = uVar38;
  if (puVar42 <= puVar8) {
    uVar28 = UVar43 + 2;
    lVar34 = *(long *)(pBVar11 + uVar28);
    pUVar12[(ulong)(lVar34 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] = uVar28;
    pUVar12[(ulong)(*(long *)((long)puVar42 + -2) * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] =
         ((int)puVar42 + -2) - iVar37;
    pUVar13[(ulong)(lVar34 * -0x30e44323405a9d00) >> (bVar23 & 0x3f)] = uVar28;
    pUVar13[(ulong)(*(long *)((long)puVar42 + -1) * -0x30e44323405a9d00) >> (bVar23 & 0x3f)] =
         ((int)puVar42 + -1) - iVar37;
    do {
      uVar28 = (uint)uVar44;
      src = puVar42;
      local_fc = uVar38;
      if ((uVar28 == 0) || ((int)*puVar42 != *(int *)((long)puVar42 - uVar44))) break;
      puVar19 = (ulong *)((long)puVar42 + 4);
      puVar25 = (ulong *)((long)puVar42 + (4 - uVar44));
      puVar27 = puVar19;
      if (puVar19 < puVar1) {
        uVar31 = *puVar19 ^ *puVar25;
        uVar29 = 0;
        if (uVar31 != 0) {
          for (; (uVar31 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
          }
        }
        pBVar40 = (BYTE *)(uVar29 >> 3 & 0x1fffffff);
        if (*puVar25 == *puVar19) {
          puVar27 = (ulong *)((long)puVar42 + 0xc);
          puVar25 = (ulong *)((long)puVar42 + (0xc - uVar44));
          do {
            if (puVar1 <= puVar27) goto LAB_00113753;
            uVar44 = *puVar25;
            uVar29 = *puVar27;
            uVar35 = uVar29 ^ uVar44;
            uVar31 = 0;
            if (uVar35 != 0) {
              for (; (uVar35 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
              }
            }
            pBVar40 = (BYTE *)((long)puVar27 + ((uVar31 >> 3 & 0x1fffffff) - (long)puVar19));
            puVar27 = puVar27 + 1;
            puVar25 = puVar25 + 1;
          } while (uVar44 == uVar29);
        }
      }
      else {
LAB_00113753:
        if ((puVar27 < puVar2) && ((int)*puVar25 == (int)*puVar27)) {
          puVar27 = (ulong *)((long)puVar27 + 4);
          puVar25 = (ulong *)((long)puVar25 + 4);
        }
        if ((puVar27 < puVar3) && ((short)*puVar25 == (short)*puVar27)) {
          puVar27 = (ulong *)((long)puVar27 + 2);
          puVar25 = (ulong *)((long)puVar25 + 2);
        }
        if (puVar27 < puVar6) {
          puVar27 = (ulong *)((long)puVar27 + (ulong)((BYTE)*puVar25 == (BYTE)*puVar27));
        }
        pBVar40 = (BYTE *)((long)puVar27 - (long)puVar19);
      }
      uVar44 = *puVar42;
      UVar43 = (int)puVar42 - iVar37;
      pUVar13[uVar44 * -0x30e44323405a9d00 >> (bVar23 & 0x3f)] = UVar43;
      pUVar12[uVar44 * -0x30e44323485a9b9d >> (bVar22 & 0x3f)] = UVar43;
      if (seqStore->maxNbSeq <=
          (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
      goto LAB_00115da4;
      if (0x20000 < seqStore->maxNbLit) goto LAB_00115dc3;
      puVar19 = (ulong *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < puVar19) goto LAB_00115d66;
      if (puVar6 < puVar42) goto LAB_00115d85;
      if (puVar4 < puVar42) {
        ZSTD_safecopyLiterals((BYTE *)puVar19,(BYTE *)puVar42,(BYTE *)puVar42,(BYTE *)puVar4);
      }
      else {
        uVar44 = puVar42[1];
        *puVar19 = *puVar42;
        puVar19[1] = uVar44;
      }
      psVar21 = seqStore->sequences;
      psVar21->litLength = 0;
      psVar21->offset = 1;
      if ((BYTE *)0xffff < pBVar40 + 1) {
        if (seqStore->longLengthID != 0) goto LAB_00115de2;
        seqStore->longLengthID = 2;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar21 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar21->matchLength = (U16)(pBVar40 + 1);
      seqStore->sequences = psVar21 + 1;
      puVar42 = (ulong *)((long)puVar42 + (long)(pBVar40 + 4));
      src = puVar42;
      uVar44 = (ulong)uVar38;
      uVar38 = uVar28;
      local_fc = uVar28;
    } while (puVar42 <= puVar8);
  }
LAB_001138b5:
  uVar38 = (uint)uVar44;
  puVar19 = puVar42;
  if (puVar8 <= puVar42) goto LAB_00115d10;
  goto LAB_00112ce8;
}

Assistant:

size_t ZSTD_compressBlock_doubleFast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    const U32 mls = ms->cParams.minMatch;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 4, ZSTD_noDict);
    case 5 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 5, ZSTD_noDict);
    case 6 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 6, ZSTD_noDict);
    case 7 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 7, ZSTD_noDict);
    }
}